

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

IColourImpl * Catch::anon_unknown_23::platformColourInstance(void)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long *plVar4;
  undefined **ppuVar5;
  
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  if (IMutableContext::currentContext == (long *)0x0) {
    IMutableContext::currentContext = (long *)operator_new(0x20);
    *IMutableContext::currentContext = 0;
    IMutableContext::currentContext[1] = 0;
    IMutableContext::currentContext[2] = 0;
    IMutableContext::currentContext[3] = 0;
    *IMutableContext::currentContext = (long)&PTR__Context_001bbb90;
    IMutableContext::currentContext[1] = 0;
    IMutableContext::currentContext[2] = 0;
    IMutableContext::currentContext[3] = 0;
  }
  plVar4 = (long *)(**(code **)(*IMutableContext::currentContext + 0x20))();
  if (plVar4 == (long *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = (**(code **)(*plVar4 + 0x90))(plVar4);
  }
  if (iVar2 == 0) {
    iVar2 = isatty(1);
    iVar2 = (iVar2 == 0) + 1;
  }
  ppuVar5 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
  if (iVar2 == 1) {
    ppuVar5 = (undefined **)&(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
  }
  *piVar3 = iVar1;
  return (IColourImpl *)ppuVar5;
}

Assistant:

ErrnoGuard::~ErrnoGuard() { errno = m_oldErrno; }